

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

int TIFFReadRGBATileExt(TIFF *tif,uint32_t col,uint32_t row,uint32_t *raster,int stop_on_error)

{
  uint32_t *puVar1;
  uint32_t w;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *fmt;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint32_t tile_ysize;
  uint32_t tile_xsize;
  TIFFRGBAImage img;
  char emsg [1024];
  uint local_4fc;
  uint local_4f8;
  uint32_t local_4f4;
  ulong local_4f0;
  uint local_4e8;
  int local_4e4;
  uint local_4e0;
  uint local_4dc;
  uint32_t *local_4d8;
  size_t local_4d0;
  TIFFRGBAImage local_4c8;
  char local_438 [1032];
  
  memset(local_438,0,0x400);
  iVar3 = TIFFIsTiled(tif);
  if (iVar3 == 0) {
    pcVar4 = TIFFFileName(tif);
    fmt = "Can\'t use TIFFReadRGBATile() with striped file.";
  }
  else {
    local_4f0 = (ulong)row;
    TIFFGetFieldDefaulted(tif,0x142,&local_4f8);
    TIFFGetFieldDefaulted(tif,0x143,&local_4fc);
    if ((col % local_4f8 == 0) && ((int)((local_4f0 & 0xffffffff) % (ulong)local_4fc) == 0)) {
      iVar3 = TIFFRGBAImageOK(tif,local_438);
      if ((iVar3 == 0) ||
         (iVar3 = TIFFRGBAImageBegin(&local_4c8,tif,stop_on_error,local_438), iVar3 == 0)) {
        pcVar4 = TIFFFileName(tif);
        TIFFErrorExtR(tif,pcVar4,"%s",local_438);
        return 0;
      }
      local_4c8.row_offset = (int)local_4f0;
      local_4dc = local_4fc + local_4c8.row_offset;
      local_4e0 = local_4c8.height;
      uVar7 = local_4c8.height - local_4c8.row_offset;
      if (local_4dc <= local_4c8.height) {
        uVar7 = local_4fc;
      }
      w = local_4c8.width - col;
      if (local_4f8 + col <= local_4c8.width) {
        w = local_4f8;
      }
      local_4c8.col_offset = col;
      iVar3 = TIFFRGBAImageGet(&local_4c8,raster,w,uVar7);
      TIFFRGBAImageEnd(&local_4c8);
      if ((w == local_4f8) && (uVar7 == local_4fc)) {
        return iVar3;
      }
      uVar5 = (ulong)w;
      local_4d0 = uVar5 * 4;
      iVar6 = -1;
      local_4f4 = w;
      local_4e8 = uVar7;
      local_4e4 = iVar3;
      local_4d8 = raster;
      for (uVar8 = 0; puVar1 = local_4d8, iVar3 = local_4e4, uVar2 = local_4f8, uVar7 != uVar8;
          uVar8 = uVar8 + 1) {
        puVar1 = local_4d8 + (ulong)(local_4fc + iVar6) * (ulong)local_4f8;
        memmove(puVar1,local_4d8 + (uVar7 + iVar6) * uVar5,local_4d0);
        _TIFFmemset(puVar1 + uVar5,0,(ulong)(uVar2 - local_4f4) << 2);
        iVar6 = iVar6 + -1;
      }
      uVar7 = local_4dc;
      if (local_4e0 < local_4dc) {
        uVar7 = local_4e0;
      }
      iVar6 = ~uVar7 + (int)local_4f0;
      for (uVar7 = local_4e8; uVar7 < local_4fc; uVar7 = uVar7 + 1) {
        _TIFFmemset(puVar1 + (ulong)(local_4fc + iVar6) * (ulong)local_4f8,0,(ulong)local_4f8 << 2);
        iVar6 = iVar6 + -1;
      }
      return iVar3;
    }
    pcVar4 = TIFFFileName(tif);
    fmt = "Row/col passed to TIFFReadRGBATile() must be topleft corner of a tile.";
  }
  TIFFErrorExtR(tif,pcVar4,fmt);
  return 0;
}

Assistant:

int TIFFReadRGBATileExt(TIFF *tif, uint32_t col, uint32_t row, uint32_t *raster,
                        int stop_on_error)
{
    char emsg[EMSG_BUF_SIZE] = "";
    TIFFRGBAImage img;
    int ok;
    uint32_t tile_xsize, tile_ysize;
    uint32_t read_xsize, read_ysize;
    uint32_t i_row;

    /*
     * Verify that our request is legal - on a tile file, and on a
     * tile boundary.
     */

    if (!TIFFIsTiled(tif))
    {
        TIFFErrorExtR(tif, TIFFFileName(tif),
                      "Can't use TIFFReadRGBATile() with striped file.");
        return (0);
    }

    TIFFGetFieldDefaulted(tif, TIFFTAG_TILEWIDTH, &tile_xsize);
    TIFFGetFieldDefaulted(tif, TIFFTAG_TILELENGTH, &tile_ysize);
    if ((col % tile_xsize) != 0 || (row % tile_ysize) != 0)
    {
        TIFFErrorExtR(tif, TIFFFileName(tif),
                      "Row/col passed to TIFFReadRGBATile() must be top"
                      "left corner of a tile.");
        return (0);
    }

    /*
     * Setup the RGBA reader.
     */

    if (!TIFFRGBAImageOK(tif, emsg) ||
        !TIFFRGBAImageBegin(&img, tif, stop_on_error, emsg))
    {
        TIFFErrorExtR(tif, TIFFFileName(tif), "%s", emsg);
        return (0);
    }

    /*
     * The TIFFRGBAImageGet() function doesn't allow us to get off the
     * edge of the image, even to fill an otherwise valid tile.  So we
     * figure out how much we can read, and fix up the tile buffer to
     * a full tile configuration afterwards.
     */

    if (row + tile_ysize > img.height)
        read_ysize = img.height - row;
    else
        read_ysize = tile_ysize;

    if (col + tile_xsize > img.width)
        read_xsize = img.width - col;
    else
        read_xsize = tile_xsize;

    /*
     * Read the chunk of imagery.
     */

    img.row_offset = row;
    img.col_offset = col;

    ok = TIFFRGBAImageGet(&img, raster, read_xsize, read_ysize);

    TIFFRGBAImageEnd(&img);

    /*
     * If our read was incomplete we will need to fix up the tile by
     * shifting the data around as if a full tile of data is being returned.
     *
     * This is all the more complicated because the image is organized in
     * bottom to top format.
     */

    if (read_xsize == tile_xsize && read_ysize == tile_ysize)
        return (ok);

    for (i_row = 0; i_row < read_ysize; i_row++)
    {
        memmove(raster + (size_t)(tile_ysize - i_row - 1) * tile_xsize,
                raster + (size_t)(read_ysize - i_row - 1) * read_xsize,
                read_xsize * sizeof(uint32_t));
        _TIFFmemset(raster + (size_t)(tile_ysize - i_row - 1) * tile_xsize +
                        read_xsize,
                    0, sizeof(uint32_t) * (tile_xsize - read_xsize));
    }

    for (i_row = read_ysize; i_row < tile_ysize; i_row++)
    {
        _TIFFmemset(raster + (size_t)(tile_ysize - i_row - 1) * tile_xsize, 0,
                    sizeof(uint32_t) * tile_xsize);
    }

    return (ok);
}